

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O2

void mbedtls_ctr_drbg_free(mbedtls_ctr_drbg_context *ctx)

{
  if (ctx != (mbedtls_ctr_drbg_context *)0x0) {
    mbedtls_aes_free(&ctx->aes_ctx);
    mbedtls_platform_zeroize(ctx,0x158);
    ctx->reseed_interval = 10000;
    ctx->reseed_counter = -1;
  }
  return;
}

Assistant:

void mbedtls_ctr_drbg_free(mbedtls_ctr_drbg_context *ctx)
{
    if (ctx == NULL) {
        return;
    }

#if defined(MBEDTLS_THREADING_C)
    /* The mutex is initialized iff f_entropy is set. */
    if (ctx->f_entropy != NULL) {
        mbedtls_mutex_free(&ctx->mutex);
    }
#endif
    mbedtls_aes_free(&ctx->aes_ctx);
    mbedtls_platform_zeroize(ctx, sizeof(mbedtls_ctr_drbg_context));
    ctx->reseed_interval = MBEDTLS_CTR_DRBG_RESEED_INTERVAL;
    ctx->reseed_counter = -1;
}